

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergeOverlappingSamples.cpp
# Opt level: O2

void mergeOverlappingSamples(float a1,float c1,float a2,float c2,float *am,float *cm)

{
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  uint uVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM0_Db;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 in_XMM2_Db;
  undefined1 auVar10 [16];
  
  auVar10._4_4_ = a1;
  auVar10._0_4_ = a2;
  auVar10._8_4_ = in_XMM2_Db;
  auVar10._12_4_ = in_XMM0_Db;
  auVar10 = minps(_DAT_0010a010,auVar10);
  auVar10 = maxps(auVar10,ZEXT416(0));
  fVar9 = auVar10._0_4_;
  fVar8 = auVar10._4_4_;
  *am = (fVar8 + fVar9) - fVar8 * fVar9;
  if ((((fVar8 != 1.0) || (NAN(fVar8))) || (fVar9 != 1.0)) || (NAN(fVar9))) {
    fVar7 = (float)(~-(uint)(fVar8 == 1.0) & (uint)c2 | -(uint)(fVar8 == 1.0) & (uint)c1);
    if (((fVar8 != 1.0) || (NAN(fVar8))) && ((fVar9 != 1.0 || (NAN(fVar9))))) {
      fVar5 = log1pf(-fVar8);
      fVar6 = log1pf(-fVar9);
      fVar6 = -fVar6;
      iVar3 = -(uint)(fVar6 < fVar9 * 3.4028235e+38);
      iVar4 = -(uint)(-fVar5 < fVar8 * 3.4028235e+38);
      auVar1._4_4_ = iVar3;
      auVar1._0_4_ = iVar3;
      auVar1._8_4_ = iVar4;
      auVar1._12_4_ = iVar4;
      uVar2 = movmskpd(extraout_EAX,auVar1);
      if ((uVar2 & 2) == 0) {
        fVar8 = 1.0;
      }
      else {
        fVar8 = -fVar5 / fVar8;
      }
      fVar7 = 1.0;
      if ((uVar2 & 1) == 0) {
        fVar9 = 1.0;
      }
      else {
        fVar9 = fVar6 / fVar9;
      }
      fVar6 = fVar6 - fVar5;
      if (1.0 < fVar6 || *am < fVar6 * 3.4028235e+38) {
        fVar7 = *am / fVar6;
      }
      fVar7 = (c1 * fVar8 + fVar9 * c2) * fVar7;
    }
  }
  else {
    fVar7 = (c1 + c2) * 0.5;
  }
  *cm = fVar7;
  return;
}

Assistant:

void
mergeOverlappingSamples (
    float  a1,
    float  c1, // Opacity and color of first sample
    float  a2,
    float  c2, // Opacity and color of second sample
    float& am,
    float& cm) // Opacity and color of merged sample
{
    //
    // This function merges two perfectly overlapping volume or point
    // samples. Given the color and opacity of two samples, it returns
    // the color and opacity of the merged sample.
    //
    // The code below is written to avoid very large rounding errors when
    // the opacity of one or both samples is very small:
    //
    // * The merged opacity must not be computed as 1 - (1-a1) \*
    //   (1-a2).  If a1 and a2 are less than about half a
    //   floating-point epsilon, the expressions (1-a1) and (1-a2)
    //   evaluate to 1.0 exactly, and the merged opacity becomes
    //   0.0. The error is amplified later in the calculation of the
    //   merged color.
    //
    //   Changing the calculation of the merged opacity to a1 + a2 -
    //   a1*a2 avoids the excessive rounding error.
    //
    // * For small x, the logarithm of 1+x is approximately equal to
    //   x, but log(1+x) returns 0 because 1+x evaluates to 1.0
    //   exactly.  This can lead to large errors in the calculation of
    //   the merged color if a1 or a2 is very small.
    //
    //   The math library function log1p(x) returns the logarithm of
    //   1+x, but without attempting to evaluate the expression 1+x
    //   when x is very small.
    //

    a1 = max (0.0f, min (a1, 1.0f));
    a2 = max (0.0f, min (a2, 1.0f));

    am = a1 + a2 - a1 * a2;

    if (a1 == 1 && a2 == 1) { cm = (c1 + c2) / 2; }
    else if (a1 == 1)
    {
        cm = c1;
    }
    else if (a2 == 1)
    {
        cm = c2;
    }
    else
    {
        static const float MAX = numeric_limits<float>::max ();

        float u1 = -log1p (-a1);
        float v1 = (u1 < a1 * MAX) ? u1 / a1 : 1;

        float u2 = -log1p (-a2);
        float v2 = (u2 < a2 * MAX) ? u2 / a2 : 1;

        float u = u1 + u2;
        float w = (u > 1 || am < u * MAX) ? am / u : 1;

        cm = (c1 * v1 + c2 * v2) * w;
    }
}